

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O1

mraa_boolean_t mraa_link_targets(char *filename,char *targetname)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  char *old_buffer;
  char *__haystack;
  
  iVar4 = 100;
  uVar3 = 0;
  __haystack = (char *)0x0;
  do {
    if ((int)uVar3 != 0) {
      pcVar2 = strstr(__haystack,targetname);
      free(__haystack);
      return (uint)(pcVar2 != (char *)0x0);
    }
    pcVar2 = (char *)realloc(__haystack,(long)iVar4);
    if (pcVar2 == (char *)0x0) {
      free(__haystack);
      uVar3 = 0;
LAB_001091c7:
      bVar1 = false;
    }
    else {
      uVar3 = readlink(filename,pcVar2,(long)iVar4);
      uVar5 = (uint)uVar3;
      if ((int)uVar5 < 0) {
        free(pcVar2);
        goto LAB_001091c7;
      }
      pcVar2[uVar5 & 0x7fffffff] = '\0';
      uVar3 = uVar3 & 0xffffffff;
      if (iVar4 <= (int)uVar5) {
        uVar3 = 0;
      }
      iVar4 = iVar4 << (iVar4 <= (int)uVar5);
      bVar1 = true;
    }
    __haystack = pcVar2;
    if (!bVar1) {
      return 0;
    }
  } while( true );
}

Assistant:

mraa_boolean_t
mraa_link_targets(const char* filename, const char* targetname)
{
    int size = 100;
    int nchars = 0;
    char* buffer = NULL;
    while (nchars == 0) {
        char* old_buffer = buffer;
        buffer = (char*) realloc(buffer, size);
        if (buffer == NULL) {
            free(old_buffer);
            return 0;
        }
        nchars = readlink(filename, buffer, size);
        if (nchars < 0) {
            free(buffer);
            return 0;
        } else {
            buffer[nchars] = '\0';
        }
        if (nchars >= size) {
            size *= 2;
            nchars = 0;
        }
    }
    if (strstr(buffer, targetname)) {
        free(buffer);
        return 1;
    } else {
        free(buffer);
        return 0;
    }
}